

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::iterate
          (SSBOBindingRenderCase *this)

{
  ostringstream *this_00;
  TestType TVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  bool bVar9;
  bool imageTestPassed;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool local_1f5;
  GLint val;
  uint local_1f0;
  GLenum prop;
  string *local_1e8;
  long local_1e0;
  string name;
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar5 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  lVar10 = (long)(this->super_LayoutBindingRenderCase).m_numBindings;
  prop = 0x9302;
  TVar1 = (this->super_LayoutBindingRenderCase).m_testType;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  if (lVar10 < 1) {
    imageTestPassed = true;
    local_1f5 = true;
  }
  else {
    local_1f0 = TVar1 - TESTTYPE_BINDING_ARRAY;
    local_1e8 = &(this->super_LayoutBindingRenderCase).m_uniformName;
    local_1f5 = true;
    lVar12 = 0;
    imageTestPassed = true;
    do {
      if (local_1f0 < 2) {
        getUniformName(&name,local_1e8,0,(int)lVar12);
      }
      else {
        getUniformName(&name,local_1e8,(int)lVar12);
      }
      iVar5 = (this->super_LayoutBindingRenderCase).m_bindings.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar12];
      val = -1;
      pcVar2 = *(code **)(lVar8 + 0x9c8);
      dVar7 = (((this->super_LayoutBindingRenderCase).m_program)->m_program).m_program;
      local_1e0 = lVar12;
      uVar6 = (**(code **)(lVar8 + 0x9a8))(dVar7,0x92e6,name._M_dataplus._M_p);
      (*pcVar2)(dVar7,0x92e6,uVar6,1,&prop,1,0,&val);
      local_1b0._0_8_ =
           ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Querying binding point for ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
      std::ostream::operator<<(this_00,val);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," == ",4);
      std::ostream::operator<<(this_00,iVar5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"Binding point query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                      ,0x7dd);
      local_1f5 = (bool)(local_1f5 & val == iVar5);
      uVar3 = (int)local_1e0 * 2;
      uVar11 = 0;
      bVar4 = true;
      do {
        bVar9 = bVar4;
        (**(code **)(lVar8 + 0x14f0))
                  ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,uVar11 | uVar3);
        bVar4 = LayoutBindingRenderCase::drawAndVerifyResult
                          (&this->super_LayoutBindingRenderCase,
                           (this->m_expectedColors).
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar11 | (long)(int)uVar3));
        imageTestPassed = (bool)(imageTestPassed & bVar4);
        uVar11 = 1;
        bVar4 = false;
      } while (bVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = local_1e0 + 1;
    } while (lVar12 != lVar10);
  }
  LayoutBindingRenderCase::setTestResult
            ((LayoutBindingRenderCase *)
             (this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,local_1f5,imageTestPassed);
  return STOP;
}

Assistant:

TestCase::IterateResult SSBOBindingRenderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const glw::GLenum		prop			= GL_BUFFER_BINDING;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Query binding point
		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getProgramResourceiv(m_program->getProgram(), GL_SHADER_STORAGE_BLOCK, gl.getProgramResourceIndex(m_program->getProgram(), GL_SHADER_STORAGE_BLOCK, name.c_str() ), 1, &prop, 1, DE_NULL, &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		if (val != binding)
			queryTestPassed = false;

		// Draw twice to render both colors within the SSBO
		for (int drawCycle = 0; drawCycle < 2; ++drawCycle)
		{
			// Set the uniform indicating the array index to be used and set the expected color
			const int arrayNdx = iterNdx*2 + drawCycle;
			gl.uniform1i(m_shaderProgramArrayNdxLoc, arrayNdx);

			if (!drawAndVerifyResult(m_expectedColors[arrayNdx]))
				imageTestPassed = false;
		}
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}